

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O2

int mixed_queue_add(mixed_segment *new,mixed_segment *segment)

{
  vector *vector;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint32_t i;
  ulong uVar4;
  mixed_segment_info info;
  
  vector = (vector *)segment->data;
  iVar3 = 0;
  memset(&info,0,0x420);
  iVar2 = mixed_segment_start(new);
  if (iVar2 != 0) {
    iVar2 = vector_add(new,vector);
    if (iVar2 != 0) {
      mixed_segment_info(&info,new);
      uVar1 = info.max_inputs;
      if (vector[2].count < info.max_inputs) {
        uVar1 = vector[2].count;
      }
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        mixed_segment_set_in(0,(uint32_t)uVar4,vector[2].data[uVar4],new);
      }
      uVar1 = info.outputs;
      if (vector[1].count < info.outputs) {
        uVar1 = vector[1].count;
      }
      iVar3 = 1;
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        mixed_segment_set_out(0,(uint32_t)uVar4,vector[1].data[uVar4],new);
      }
    }
  }
  return iVar3;
}

Assistant:

MIXED_EXPORT int mixed_queue_add(struct mixed_segment *new, struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  struct mixed_segment_info info = {0};

  if(!mixed_segment_start(new))
    return 0;
  
  if(!vector_add(new, (struct vector *)data))
    return 0;
  
  mixed_segment_info(&info, new);
  uint32_t ins = MIN(data->in_count, info.max_inputs);
  for(uint32_t i=0; i<ins; ++i){
    mixed_segment_set_in(MIXED_BUFFER, i, data->in[i], new);
  }
  uint32_t outs = MIN(data->out_count, info.outputs);
  for(uint32_t i=0; i<outs; ++i){
    mixed_segment_set_out(MIXED_BUFFER, i, data->out[i], new);
  }
  return 1;
}